

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtmd.cpp
# Opt level: O1

int32_t mtmd_helper_bitmap_init_from_file(char *fname,mtmd_bitmap *output)

{
  bool bVar1;
  uchar *__src;
  int32_t iVar2;
  clip_image_u8_ptr img_u8;
  __uniq_ptr_impl<clip_image_u8,_clip_image_u8_deleter> local_18;
  
  local_18._M_t.super__Tuple_impl<0UL,_clip_image_u8_*,_clip_image_u8_deleter>.
  super__Head_base<0UL,_clip_image_u8_*,_false>._M_head_impl =
       (tuple<clip_image_u8_*,_clip_image_u8_deleter>)clip_image_u8_init();
  bVar1 = clip_image_load_from_file
                    (fname,(clip_image_u8 *)
                           local_18._M_t.
                           super__Tuple_impl<0UL,_clip_image_u8_*,_clip_image_u8_deleter>.
                           super__Head_base<0UL,_clip_image_u8_*,_false>._M_head_impl);
  if (bVar1) {
    __src = clip_image_u8_get_data
                      ((clip_image_u8 *)
                       local_18._M_t.super__Tuple_impl<0UL,_clip_image_u8_*,_clip_image_u8_deleter>.
                       super__Head_base<0UL,_clip_image_u8_*,_false>._M_head_impl,&output->nx,
                       &output->ny);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&output->data,(ulong)(output->nx * output->ny * 3));
    memcpy((output->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,__src,(ulong)(output->nx * output->ny * 3));
    iVar2 = 0;
  }
  else {
    iVar2 = 1;
    if ((int)g_logger_state.verbosity_thold < 5) {
      clip_log_internal(GGML_LOG_LEVEL_ERROR,"Unable to load image %s\n",fname);
    }
  }
  std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>::~unique_ptr
            ((unique_ptr<clip_image_u8,_clip_image_u8_deleter> *)&local_18);
  return iVar2;
}

Assistant:

int32_t mtmd_helper_bitmap_init_from_file(const char * fname, mtmd_bitmap & output) {
    clip_image_u8_ptr img_u8(clip_image_u8_init());
    bool ok = clip_image_load_from_file(fname, img_u8.get());
    if (!ok) {
        LOG_ERR("Unable to load image %s\n", fname);
        return 1;
    }
    unsigned char * data = clip_image_u8_get_data(img_u8.get(), &output.nx, &output.ny);
    output.data.resize(output.nx * output.ny * 3);
    std::memcpy(output.data.data(), data, output.nx * output.ny * 3);
    return 0;
}